

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

bool __thiscall
Storage::Tape::Oric::Parser::sync_and_get_encoding_speed
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  int iVar1;
  SymbolType SVar2;
  
  this->detection_mode_ = Sync;
  while ((iVar1 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->_vptr_Tape)(), (char)iVar1 == '\0' &&
         (SVar2 = Parser<Storage::Tape::Oric::SymbolType>::get_next_symbol
                            ((Parser<Storage::Tape::Oric::SymbolType> *)this,tape),
         SVar2 != FoundSlow))) {
    if (SVar2 == FoundFast) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::sync_and_get_encoding_speed(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	detection_mode_ = Sync;
	while(!tape->is_at_end()) {
		const SymbolType symbol = get_next_symbol(tape);
		switch(symbol) {
			case SymbolType::FoundSlow: return false;
			case SymbolType::FoundFast: return true;
			default: break;
		}
	}
	return false;
}